

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene.cxx
# Opt level: O3

void __thiscall xray_re::b_params::save_v12(b_params *this,xr_ini_writer *w)

{
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  
  xr_ini_writer::open_section(w,"build_params");
  xr_ini_writer::write(w,0x1f2245,(void *)(ulong)(uint)this->lm_jitter_samples,in_RCX);
  xr_ini_writer::write(w,0x1f225a,__buf,in_RCX);
  xr_ini_writer::write(w,0x1f2270,(void *)0x2,in_RCX);
  xr_ini_writer::write(w,0x1f227e,(void *)0x0,in_RCX);
  xr_ini_writer::write(w,0x1f2295,(void *)(ulong)this->lm_rms,in_RCX);
  xr_ini_writer::write(w,0x1f229f,(void *)(ulong)this->lm_rms_zero,in_RCX);
  xr_ini_writer::write(w,0x1f22ae,__buf_00,in_RCX);
  xr_ini_writer::write(w,0x1f22b9,__buf_01,in_RCX);
  xr_ini_writer::write(w,0x1f22c4,__buf_02,in_RCX);
  xr_ini_writer::write(w,0x1f22cf,__buf_03,in_RCX);
  xr_ini_writer::write(w,0x1f22da,__buf_04,in_RCX);
  xr_ini_writer::write(w,0x1f22e5,__buf_05,in_RCX);
  xr_ini_writer::write(w,0x1f22f0,__buf_06,in_RCX);
  xr_ini_writer::write(w,0x1f22fd,__buf_07,in_RCX);
  xr_ini_writer::close_section(w);
  return;
}

Assistant:

void b_params::save_v12(xr_ini_writer *w)
{
	w->open_section("build_params");
	w->write("light_jitter_samples", lm_jitter_samples);
	w->write("light_pixel_per_meter", lm_pixels_per_meter);
	w->write("light_quality", 2);			// TEMP
	w->write("light_quality_reserved", 0);	// TEMP
	w->write("light_rms", lm_rms);
	w->write("light_rms_zero", lm_rms_zero);
	w->write("reserved_0", pm_uv);
	w->write("reserved_1", pm_pos);
	w->write("reserved_2", pm_curv);
	w->write("reserved_3", pm_border_h_angle);
	w->write("reserved_4", pm_border_h_distance);
	w->write("reserved_5", pm_heuristic);
	w->write("smooth_angle", sm_angle);
	w->write("weld_distance", weld_distance);
	w->close_section();
}